

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitor.c
# Opt level: O2

void temperature_monitor(void)

{
  pal_result pVar1;
  pal_led_color color;
  int iVar2;
  int iVar3;
  bool bVar4;
  float fVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  unsigned_short t;
  float local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  
  pVar1 = PAL_ERROR_ARG;
  fVar5 = 0.0;
  uVar6 = 0;
  uVar7 = 0;
  uVar8 = 0;
  iVar2 = 3;
  while (iVar3 = iVar2 + -1, iVar2 != 0) {
    local_38 = fVar5;
    uStack_34 = uVar6;
    uStack_30 = uVar7;
    uStack_2c = uVar8;
    pVar1 = pal_temperature_get(&t);
    if (pVar1 == PAL_ERROR_ARG) {
      pal_halt();
      fVar5 = local_38;
    }
    else {
      fVar5 = local_38;
      if (pVar1 == PAL_OK) {
        fVar5 = pal_temperature_to_celsius(t);
        fVar5 = local_38 + fVar5;
      }
    }
    bVar4 = iVar2 != 1;
    uVar6 = uStack_34;
    uVar7 = uStack_30;
    uVar8 = uStack_2c;
    iVar2 = iVar3;
    if (bVar4) {
      local_38 = fVar5;
      pal_sleep(1000);
      fVar5 = local_38;
      uVar6 = uStack_34;
      uVar7 = uStack_30;
      uVar8 = uStack_2c;
    }
  }
  if (pVar1 == PAL_OK) {
    fVar5 = fVar5 / 3.0;
    if (fVar5 <= 120.0) {
      color = -(uint)(fVar5 < -10.0 || 60.0 < fVar5) & PAL_LED_RED ^ PAL_LED_GREEN;
      if (fVar5 < -38.0) {
        color = PAL_LED_RED;
      }
      if (80.0 < fVar5) {
        color = PAL_LED_RED;
      }
      local_38 = fVar5;
      uStack_34 = uVar6;
      uStack_30 = uVar7;
      uStack_2c = uVar8;
      pal_led_set_color(color);
      pal_fan_set_speed((int)(local_38 * 10.0));
      return;
    }
    pal_led_set_color(PAL_LED_RED);
    pal_fan_set_speed(0);
  }
  else {
    pal_led_set_color(PAL_LED_RED);
  }
  pal_halt();
  return;
}

Assistant:

void temperature_monitor(void) {
    unsigned short t;
    float t_c = 0.0;
    pal_result result = PAL_ERROR_ARG;
    for (int i = 0; i < NUMBER_SAMPLES; i++)
    {
        result = pal_temperature_get(&t);
        if (result == PAL_OK) {
            t_c += pal_temperature_to_celsius(t);
        }
        else if (result == PAL_ERROR_ARG) {
            pal_halt();
        }

        if ((i + 1) < NUMBER_SAMPLES)
            pal_sleep(SAMPLE_INTERVAL);
    }

    t_c /= (float)NUMBER_SAMPLES;

    if (result == PAL_OK)
    {
        if (t_c > 120.0) {
            pal_led_set_color(PAL_LED_RED);
            pal_fan_set_speed((int)(0.0f));
            pal_halt();
            t_c = 0;
        }
        else {
            if ((t_c > 80.0) || (t_c < -38.0)) {
                pal_led_set_color(PAL_LED_RED);
            }
            else if ((t_c > 60.0) || (t_c < -10.0)) {
                pal_led_set_color(PAL_LED_YELLOW);
            }
            else {
                pal_led_set_color(PAL_LED_GREEN);
            }
            pal_fan_set_speed((int)(t_c * 10.0f));
        }
    }
    else {
        pal_led_set_color(PAL_LED_RED);
        pal_halt();
    }
}